

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O3

void __thiscall
TPZHybridizeHDiv::InsertPeriferalMaterialObjects
          (TPZHybridizeHDiv *this,TPZVec<TPZCompMesh_*> *meshvec_Hybrid)

{
  int iVar1;
  int iVar2;
  TPZCompMesh *pTVar3;
  TPZMaterial *pTVar4;
  TPZNullMaterial<double> *pTVar5;
  
  if ((this->fLagrangeInterface != 0) && (this->fHDivWrapMatid != 0)) {
    pTVar3 = meshvec_Hybrid->fStore[1];
    iVar1 = pTVar3->fDimModel;
    pTVar4 = TPZCompMesh::FindMaterial(pTVar3,this->fLagrangeInterface);
    if (pTVar4 == (TPZMaterial *)0x0) {
      pTVar5 = (TPZNullMaterial<double> *)operator_new(0x50);
      iVar2 = this->fLagrangeInterface;
      *(undefined ***)
       &(pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).super_TPZMaterialT<double>.
        super_TPZMaterial = &PTR__TPZSavable_018c8710;
      TPZMatBase<double,_TPZMatSingleSpaceT<double>_>::TPZMatBase
                ((TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *)pTVar5,&PTR_PTR_018c7c38,iVar2);
      *(undefined ***)
       &(pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).super_TPZMaterialT<double>.
        super_TPZMaterial = &PTR__TPZNullMaterial_018c7a58;
      (pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).
      super_TPZMatSingleSpaceT<double>.super_TPZMatSingleSpace =
           (TPZMatSingleSpace)&PTR__TPZNullMaterial_018c7ba0;
      pTVar5->fDim = 1;
      pTVar5->fNState = 1;
      TPZNullMaterial<double>::SetDimension(pTVar5,iVar1 + -1);
      pTVar5->fNState = this->fNState;
      TPZCompMesh::InsertMaterialObject(pTVar3,(TPZMaterial *)pTVar5);
    }
    pTVar4 = TPZCompMesh::FindMaterial(pTVar3,this->fLagrangeInterfaceEnd);
    if (pTVar4 == (TPZMaterial *)0x0) {
      pTVar5 = (TPZNullMaterial<double> *)operator_new(0x50);
      iVar2 = this->fLagrangeInterfaceEnd;
      *(undefined ***)
       &(pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).super_TPZMaterialT<double>.
        super_TPZMaterial = &PTR__TPZSavable_018c8710;
      TPZMatBase<double,_TPZMatSingleSpaceT<double>_>::TPZMatBase
                ((TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *)pTVar5,&PTR_PTR_018c7c38,iVar2);
      *(undefined ***)
       &(pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).super_TPZMaterialT<double>.
        super_TPZMaterial = &PTR__TPZNullMaterial_018c7a58;
      (pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).
      super_TPZMatSingleSpaceT<double>.super_TPZMatSingleSpace =
           (TPZMatSingleSpace)&PTR__TPZNullMaterial_018c7ba0;
      pTVar5->fDim = 1;
      pTVar5->fNState = 1;
      TPZNullMaterial<double>::SetDimension(pTVar5,iVar1 + -1);
      pTVar5->fNState = this->fNState;
      TPZCompMesh::InsertMaterialObject(pTVar3,(TPZMaterial *)pTVar5);
    }
    pTVar3 = *meshvec_Hybrid->fStore;
    if (pTVar3 != (TPZCompMesh *)0x0) {
      pTVar4 = TPZCompMesh::FindMaterial(pTVar3,this->fHDivWrapMatid);
      if (pTVar4 == (TPZMaterial *)0x0) {
        pTVar5 = (TPZNullMaterial<double> *)operator_new(0x50);
        iVar2 = this->fHDivWrapMatid;
        *(undefined ***)
         &(pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).super_TPZMaterialT<double>
          .super_TPZMaterial = &PTR__TPZSavable_018c8710;
        TPZMatBase<double,_TPZMatSingleSpaceT<double>_>::TPZMatBase
                  ((TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *)pTVar5,&PTR_PTR_018c7c38,iVar2
                  );
        *(undefined ***)
         &(pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).super_TPZMaterialT<double>
          .super_TPZMaterial = &PTR__TPZNullMaterial_018c7a58;
        (pTVar5->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>_>).
        super_TPZMatSingleSpaceT<double>.super_TPZMatSingleSpace =
             (TPZMatSingleSpace)&PTR__TPZNullMaterial_018c7ba0;
        pTVar5->fDim = 1;
        pTVar5->fNState = 1;
        TPZNullMaterial<double>::SetDimension(pTVar5,iVar1 + -1);
        pTVar5->fNState = this->fNState;
        TPZCompMesh::InsertMaterialObject(pTVar3,(TPZMaterial *)pTVar5);
        return;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!"
             ,0x69);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
             ,0x31d);
}

Assistant:

void TPZHybridizeHDiv::InsertPeriferalMaterialObjects(TPZVec<TPZCompMesh *> &meshvec_Hybrid) {
    if (fLagrangeInterface == 0 || fHDivWrapMatid == 0) {
        std::cerr << "Using uninitialized TPZHybridizeHDiv object. You need to call ComputePeriferalMaterialIds function first!" << std::endl;
        DebugStop();
    }


    TPZCompMesh *pressuremesh = meshvec_Hybrid[1];
    int dim = pressuremesh->Dimension();
    
    if (!pressuremesh->FindMaterial(fLagrangeInterface)) {
        auto matPerif = new TPZNullMaterial(fLagrangeInterface);
        matPerif->SetDimension(dim-1);
        matPerif->SetNStateVariables(fNState);
        pressuremesh->InsertMaterialObject(matPerif);
    }
    if (!pressuremesh->FindMaterial(fLagrangeInterfaceEnd)) {
        auto matPerif = new TPZNullMaterial(fLagrangeInterfaceEnd);
        matPerif->SetDimension(dim-1);
        matPerif->SetNStateVariables(fNState);
        pressuremesh->InsertMaterialObject(matPerif);
    }
    
    if(meshvec_Hybrid[0]!=NULL){

        TPZCompMesh *fluxmesh = meshvec_Hybrid[0];
        if (!fluxmesh->FindMaterial(fHDivWrapMatid)) {
            auto matPerif = new TPZNullMaterial(fHDivWrapMatid);
            matPerif->SetDimension(dim-1);
            matPerif->SetNStateVariables(fNState);
            fluxmesh->InsertMaterialObject(matPerif);
        }
    }
}